

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_doFollowPlayer(void)

{
  bool bVar1;
  int iVar2;
  AActor *pAVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  TAngle<double> local_20;
  double local_18;
  double sy;
  double sx;
  
  bVar1 = TObjPtr<AActor>::operator!=
                    ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0),(AActor *)0x0)
  ;
  dVar5 = f_oldloc.x;
  if (bVar1) {
    pAVar3 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    dVar4 = AActor::X(pAVar3);
    dVar6 = f_oldloc.y;
    if ((dVar5 == dVar4) && (!NAN(dVar5) && !NAN(dVar4))) {
      pAVar3 = TObjPtr<AActor>::operator->
                         ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
      dVar5 = AActor::Y(pAVar3);
      if ((dVar6 == dVar5) && (!NAN(dVar6) && !NAN(dVar5))) {
        return;
      }
    }
    pAVar3 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    dVar5 = AActor::X(pAVar3);
    m_x = dVar5 - m_w / 2.0;
    pAVar3 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    dVar5 = AActor::Y(pAVar3);
    m_y = dVar5 - m_h / 2.0;
    m_x2 = m_x + m_w;
    m_y2 = m_y + m_h;
    pAVar3 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    dVar6 = AActor::X(pAVar3);
    dVar5 = f_oldloc.y;
    sy = dVar6 - f_oldloc.x;
    pAVar3 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    local_18 = AActor::Y(pAVar3);
    local_18 = dVar5 - local_18;
    iVar2 = FIntCVar::operator_cast_to_int(&am_rotate);
    if ((iVar2 == 1) ||
       ((iVar2 = FIntCVar::operator_cast_to_int(&am_rotate), iVar2 == 2 && ((viewactive & 1U) != 0))
       )) {
      TObjPtr<AActor>::operator->((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
      TAngle<double>::operator-(&local_20,90.0);
      AM_rotate(&sy,&local_18,&local_20);
    }
    AM_ScrollParchment(sy,local_18);
    pAVar3 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    f_oldloc.x = AActor::X(pAVar3);
    pAVar3 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    f_oldloc.y = AActor::Y(pAVar3);
  }
  return;
}

Assistant:

void AM_doFollowPlayer ()
{
	double sx, sy;

    if (players[consoleplayer].camera != NULL &&
		(f_oldloc.x != players[consoleplayer].camera->X() ||
		 f_oldloc.y != players[consoleplayer].camera->Y()))
	{
		m_x = players[consoleplayer].camera->X() - m_w/2;
		m_y = players[consoleplayer].camera->Y() - m_h/2;
		m_x2 = m_x + m_w;
		m_y2 = m_y + m_h;

  		// do the parallax parchment scrolling.
		sx = (players[consoleplayer].camera->X() - f_oldloc.x);
		sy = (f_oldloc.y - players[consoleplayer].camera->Y());
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotate (&sx, &sy, players[consoleplayer].camera->Angles.Yaw - 90);
		}
		AM_ScrollParchment (sx, sy);

		f_oldloc.x = players[consoleplayer].camera->X();
		f_oldloc.y = players[consoleplayer].camera->Y();
	}
}